

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddIte.c
# Opt level: O2

DdNode * cuddAddIteRecur(DdManager *dd,DdNode *f,DdNode *g,DdNode *h)

{
  int *piVar1;
  uint index;
  uint uVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  DdNode *h_1;
  uint uVar8;
  uint uVar9;
  DdHalfWord index_00;
  uint uVar10;
  DdNode *local_38;
  
  pDVar4 = dd->one;
  pDVar3 = g;
  if ((pDVar4 != f) && (pDVar5 = dd->zero, pDVar3 = h, pDVar5 != f)) {
    if (g == f) {
      g = pDVar4;
    }
    if (h == f) {
      h = pDVar5;
    }
    pDVar3 = g;
    if ((g != h) && (pDVar3 = f, h != pDVar5 || g != pDVar4)) {
      index = f->index;
      uVar9 = 0x7fffffff;
      uVar10 = 0x7fffffff;
      if ((ulong)index != 0x7fffffff) {
        uVar10 = dd->perm[index];
      }
      if ((ulong)g->index != 0x7fffffff) {
        uVar9 = dd->perm[g->index];
      }
      uVar8 = 0x7fffffff;
      if ((ulong)h->index != 0x7fffffff) {
        uVar8 = dd->perm[h->index];
      }
      uVar2 = uVar9;
      if (uVar8 < uVar9) {
        uVar2 = uVar8;
      }
      if ((uVar10 < uVar2) &&
         (((pDVar3 = (f->type).kids.T, pDVar3 == pDVar4 &&
           (pDVar6 = h, pDVar7 = g, (f->type).kids.E == pDVar5)) ||
          ((pDVar3 == pDVar5 && (pDVar6 = g, pDVar7 = h, (f->type).kids.E == pDVar4)))))) {
        pDVar4 = cuddUniqueInter(dd,index,pDVar7,pDVar6);
        return pDVar4;
      }
      pDVar3 = cuddCacheLookup(dd,2,f,g,h);
      if (pDVar3 == (DdNode *)0x0) {
        if (uVar2 < uVar10) {
          index_00 = 0xffffffff;
          pDVar4 = f;
          uVar10 = uVar2;
          local_38 = f;
        }
        else {
          index_00 = f->index;
          pDVar4 = (f->type).kids.T;
          local_38 = (f->type).kids.E;
        }
        pDVar5 = g;
        pDVar3 = g;
        if (uVar9 == uVar10) {
          index_00 = g->index;
          pDVar3 = (g->type).kids.T;
          pDVar5 = (g->type).kids.E;
        }
        pDVar6 = h;
        pDVar7 = h;
        if (uVar8 == uVar10) {
          index_00 = h->index;
          pDVar6 = (h->type).kids.T;
          pDVar7 = (h->type).kids.E;
        }
        pDVar4 = cuddAddIteRecur(dd,pDVar4,pDVar3,pDVar6);
        if (pDVar4 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar3 = cuddAddIteRecur(dd,local_38,pDVar5,pDVar7);
          if (pDVar3 != (DdNode *)0x0) {
            piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            pDVar5 = pDVar4;
            if ((pDVar4 == pDVar3) ||
               (pDVar5 = cuddUniqueInter(dd,index_00,pDVar4,pDVar3), pDVar5 != (DdNode *)0x0)) {
              piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + -1;
              piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + -1;
              cuddCacheInsert(dd,2,f,g,h,pDVar5);
              return pDVar5;
            }
            Cudd_RecursiveDeref(dd,pDVar4);
            pDVar4 = pDVar3;
          }
          Cudd_RecursiveDeref(dd,pDVar4);
        }
        pDVar3 = (DdNode *)0x0;
      }
    }
  }
  return pDVar3;
}

Assistant:

DdNode *
cuddAddIteRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode * h)
{
    DdNode *one,*zero;
    DdNode *r,*Fv,*Fnv,*Gv,*Gnv,*Hv,*Hnv,*t,*e;
    unsigned int topf,topg,toph,v;
    int index = -1;

    statLine(dd);
    /* Trivial cases. */

    /* One variable cases. */
    if (f == (one = DD_ONE(dd))) {      /* ITE(1,G,H) = G */
        return(g);
    }
    if (f == (zero = DD_ZERO(dd))) {    /* ITE(0,G,H) = H */
        return(h);
    }

    /* From now on, f is known to not be a constant. */
    addVarToConst(f,&g,&h,one,zero);

    /* Check remaining one variable cases. */
    if (g == h) {                       /* ITE(F,G,G) = G */
        return(g);
    }

    if (g == one) {                     /* ITE(F,1,0) = F */
        if (h == zero) return(f);
    }

    topf = cuddI(dd,f->index);
    topg = cuddI(dd,g->index);
    toph = cuddI(dd,h->index);
    v = ddMin(topg,toph);

    /* A shortcut: ITE(F,G,H) = (x,G,H) if F=(x,1,0), x < top(G,H). */
    if (topf < v && cuddT(f) == one && cuddE(f) == zero) {
        r = cuddUniqueInter(dd,(int)f->index,g,h);
        return(r);
    }
    if (topf < v && cuddT(f) == zero && cuddE(f) == one) {
        r = cuddUniqueInter(dd,(int)f->index,h,g);
        return(r);
    }

    /* Check cache. */
    r = cuddCacheLookup(dd,DD_ADD_ITE_TAG,f,g,h);
    if (r != NULL) {
        return(r);
    }

    /* Compute cofactors. */
    if (topf <= v) {
        v = ddMin(topf,v);      /* v = top_var(F,G,H) */
        index = f->index;
        Fv = cuddT(f); Fnv = cuddE(f);
    } else {
        Fv = Fnv = f;
    }
    if (topg == v) {
        index = g->index;
        Gv = cuddT(g); Gnv = cuddE(g);
    } else {
        Gv = Gnv = g;
    }
    if (toph == v) {
        index = h->index;
        Hv = cuddT(h); Hnv = cuddE(h);
    } else {
        Hv = Hnv = h;
    }
    
    /* Recursive step. */
    t = cuddAddIteRecur(dd,Fv,Gv,Hv);
    if (t == NULL) return(NULL);
    cuddRef(t);

    e = cuddAddIteRecur(dd,Fnv,Gnv,Hnv);
    if (e == NULL) {
        Cudd_RecursiveDeref(dd,t);
        return(NULL);
    }
    cuddRef(e);

    r = (t == e) ? t : cuddUniqueInter(dd,index,t,e);
    if (r == NULL) {
        Cudd_RecursiveDeref(dd,t);
        Cudd_RecursiveDeref(dd,e);
        return(NULL);
    }
    cuddDeref(t);
    cuddDeref(e);

    cuddCacheInsert(dd,DD_ADD_ITE_TAG,f,g,h,r);

    return(r);

}